

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_peak2_init_preallocated(ma_peak2_config *pConfig,void *pHeap,ma_peak2 *pFilter)

{
  ma_result mVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ma_biquad_config bqConfig;
  ma_biquad_config local_50;
  
  mVar1 = MA_INVALID_ARGS;
  if (pFilter != (ma_peak2 *)0x0) {
    (pFilter->bq)._pHeap = (void *)0x0;
    *(undefined8 *)&(pFilter->bq)._ownsHeap = 0;
    (pFilter->bq).pR1 = (ma_biquad_coefficient *)0x0;
    (pFilter->bq).pR2 = (ma_biquad_coefficient *)0x0;
    (pFilter->bq).b2 = (ma_biquad_coefficient)0x0;
    (pFilter->bq).a1 = (ma_biquad_coefficient)0x0;
    *(undefined8 *)&(pFilter->bq).a2 = 0;
    (pFilter->bq).format = ma_format_unknown;
    (pFilter->bq).channels = 0;
    (pFilter->bq).b0 = (ma_biquad_coefficient)0x0;
    (pFilter->bq).b1 = (ma_biquad_coefficient)0x0;
    if (pConfig != (ma_peak2_config *)0x0) {
      dVar4 = pConfig->q;
      dVar2 = (pConfig->frequency * 6.283185307179586) / (double)pConfig->sampleRate;
      dVar3 = sin(dVar2);
      dVar2 = sin(1.5707963267948966 - dVar2);
      dVar3 = dVar3 / (dVar4 + dVar4);
      dVar4 = pow(10.0,pConfig->gainDB / 40.0);
      local_50.b0 = dVar3 * dVar4;
      local_50.b1 = dVar2 * -2.0;
      local_50.b2 = 1.0 - local_50.b0;
      local_50.b0 = local_50.b0 + 1.0;
      dVar3 = dVar3 / dVar4;
      local_50.a0 = dVar3 + 1.0;
      local_50.a2 = 1.0 - dVar3;
      local_50.format = pConfig->format;
      local_50.channels = pConfig->channels;
      local_50.a1 = local_50.b1;
      mVar1 = ma_biquad_init_preallocated(&local_50,pHeap,&pFilter->bq);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_peak2_init_preallocated(const ma_peak2_config* pConfig, void* pHeap, ma_peak2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFilter);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_peak2__get_biquad_config(pConfig);
    result = ma_biquad_init_preallocated(&bqConfig, pHeap, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}